

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

char * __thiscall Fl_Text_Buffer::line_text(Fl_Text_Buffer *this,int pos)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  int *piVar3;
  int start;
  int local_28;
  int local_24;
  
  _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),pos);
  iVar1 = findchar_backward(this,pos,10,&local_28);
  start = local_28 + 1;
  if (iVar1 == 0) {
    start = 0;
  }
  _local_28 = CONCAT44(pos,local_28);
  iVar1 = findchar_forward(this,pos,10,&local_24);
  piVar3 = &this->mLength;
  if (iVar1 != 0) {
    piVar3 = &local_24;
  }
  pcVar2 = text_range(this,start,*piVar3);
  return pcVar2;
}

Assistant:

char *Fl_Text_Buffer::line_text(int pos) const {
  return text_range(line_start(pos), line_end(pos));
}